

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

bool sglr::isValidStencilOp(deUint32 op)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((3 < op - 0x1e00) && (1 < op - 0x8507)) && (op != 0)) && (op != 0x150a)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool isValidStencilOp (deUint32 op)
{
	switch (op)
	{
		case GL_KEEP:
		case GL_ZERO:
		case GL_REPLACE:
		case GL_INCR:
		case GL_INCR_WRAP:
		case GL_DECR:
		case GL_DECR_WRAP:
		case GL_INVERT:
			return true;

		default:
			return false;
	}
}